

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

void __thiscall QMap<QObject_*,_QScroller_*>::detach(QMap<QObject_*,_QScroller_*> *this)

{
  bool bVar1;
  QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>
  *in_RDI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>_>
  *unaff_retaddr;
  QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>
  *t;
  
  t = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>_>
                      *)0xa8de0c);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>_>
    ::detach(unaff_retaddr);
  }
  else {
    operator_new(0x38);
    QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>
    ::QMapData(in_RDI);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QObject_*,_QScroller_*,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_QScroller_*>_>_>_>_>
    ::reset(unaff_retaddr,t);
  }
  return;
}

Assistant:

void detach()
    {
        if (d)
            d.detach();
        else
            d.reset(new MapData);
    }